

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

int __thiscall QCompletionModel::completionCount(QCompletionModel *this)

{
  QCompletionEngine *pQVar1;
  int iVar2;
  
  iVar2 = QCompletionEngine::matchCount((this->engine).d);
  if (iVar2 != 0) {
    pQVar1 = (this->engine).d;
    (*pQVar1->_vptr_QCompletionEngine[2])(pQVar1,0x7fffffff);
    iVar2 = QCompletionEngine::matchCount((this->engine).d);
    return iVar2;
  }
  return 0;
}

Assistant:

int QCompletionModel::completionCount() const
{
    if (!engine->matchCount())
        return 0;

    engine->filterOnDemand(INT_MAX);
    return engine->matchCount();
}